

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::OperatorResolver::visit(OperatorResolver *this,InPlaceOperator *o)

{
  Allocator *this_00;
  bool bVar1;
  uint uVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  BinaryOperator *args_2;
  TypeCast *args_2_00;
  char **args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  TypeCast *resultCast;
  BinaryOperator *binaryOp;
  string local_130;
  char *local_110;
  CompileMessage local_108;
  undefined1 local_d0 [8];
  BinaryOperatorTypes opTypes;
  Type sourceType;
  Type destType;
  char *local_60;
  CompileMessage local_58;
  InPlaceOperator *local_20;
  InPlaceOperator *o_local;
  OperatorResolver *this_local;
  
  local_20 = o;
  o_local = (InPlaceOperator *)this;
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,o);
  uVar2 = (*(local_20->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])();
  if ((uVar2 & 1) == 0) {
    (this->super_ErrorIgnoringRewritingASTVisitor).numFails =
         (this->super_ErrorIgnoringRewritingASTVisitor).numFails + 1;
    this_local = (OperatorResolver *)local_20;
  }
  else {
    pEVar3 = pool_ref<soul::AST::Expression>::operator->(&local_20->target);
    uVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
    if ((uVar2 & 1) == 0) {
      pEVar3 = &local_20->super_Expression;
      local_60 = BinaryOp::getSymbol(local_20->operation);
      Errors::operatorNeedsAssignableTarget<char_const*>(&local_58,(Errors *)&local_60,args);
      AST::Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_58,false);
    }
    pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_20->source);
    SanityCheckPass::throwErrorIfNotReadableValue(pEVar3);
    pEVar3 = pool_ref<soul::AST::Expression>::operator->(&local_20->target);
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&sourceType.structure);
    pEVar3 = pool_ref<soul::AST::Expression>::operator->(&local_20->source);
    (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&opTypes.operandType.structure);
    BinaryOp::getTypes((BinaryOperatorTypes *)local_d0,local_20->operation,
                       (Type *)&sourceType.structure,(Type *)&opTypes.operandType.structure);
    bVar1 = Type::isValid((Type *)local_d0);
    if (!bVar1) {
      pEVar3 = &local_20->super_Expression;
      local_110 = BinaryOp::getSymbol(local_20->operation);
      Type::getDescription_abi_cxx11_(&local_130,(Type *)&opTypes.operandType.structure);
      Type::getDescription_abi_cxx11_((string *)&binaryOp,(Type *)&sourceType.structure);
      Errors::illegalTypesForBinaryOperator<char_const*,std::__cxx11::string,std::__cxx11::string>
                (&local_108,(Errors *)&local_110,(char **)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&binaryOp,
                 in_R8);
      AST::Context::throwError(&(pEVar3->super_Statement).super_ASTObject.context,&local_108,false);
    }
    pEVar3 = &local_20->super_Expression;
    pEVar4 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_20->target);
    SanityCheckPass::expectSilentCastPossible
              (&(pEVar3->super_Statement).super_ASTObject.context,
               (Type *)&opTypes.resultType.structure,pEVar4);
    pEVar3 = &local_20->super_Expression;
    pEVar4 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_20->source);
    SanityCheckPass::expectSilentCastPossible
              (&(pEVar3->super_Statement).super_ASTObject.context,
               (Type *)&opTypes.resultType.structure,pEVar4);
    args_2 = AST::Allocator::
             allocate<soul::AST::BinaryOperator,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::pool_ref<soul::AST::Expression>&,soul::BinaryOp::Op&>
                       ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                        &(local_20->super_Expression).super_Statement.super_ASTObject.context,
                        &local_20->target,&local_20->source,&local_20->operation);
    bVar1 = Type::isBoundedInt((Type *)&sourceType.structure);
    if (((bVar1) && (bVar1 = Type::isInteger((Type *)&opTypes.operandType.structure), bVar1)) &&
       ((local_20->operation == add || (local_20->operation == subtract)))) {
      this_00 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      pEVar3 = pool_ref<soul::AST::Expression>::operator->(&local_20->source);
      args_2_00 = AST::Allocator::
                  allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type&,soul::AST::BinaryOperator&>
                            (this_00,&(pEVar3->super_Statement).super_ASTObject.context,
                             (Type *)&sourceType.structure,args_2);
      this_local = (OperatorResolver *)
                   AST::Allocator::
                   allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::TypeCast&>
                             ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                              &(local_20->super_Expression).super_Statement.super_ASTObject.context,
                              &local_20->target,args_2_00);
    }
    else {
      this_local = (OperatorResolver *)
                   AST::Allocator::
                   allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::BinaryOperator&>
                             ((this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                              &(local_20->super_Expression).super_Statement.super_ASTObject.context,
                              &local_20->target,args_2);
    }
    TypeRules::BinaryOperatorTypes::~BinaryOperatorTypes((BinaryOperatorTypes *)local_d0);
    Type::~Type((Type *)&opTypes.operandType.structure);
    Type::~Type((Type *)&sourceType.structure);
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visit (AST::InPlaceOperator& o) override
        {
            super::visit (o);

            if (! o.isResolved())
            {
                ++numFails;
                return o;
            }

            if (! o.target->isAssignable())
                o.context.throwError (Errors::operatorNeedsAssignableTarget (BinaryOp::getSymbol (o.operation)));

            SanityCheckPass::throwErrorIfNotReadableValue (o.source);

            auto destType    = o.target->getResultType();
            auto sourceType  = o.source->getResultType();

            auto opTypes = BinaryOp::getTypes (o.operation, destType, sourceType);

            if (! opTypes.resultType.isValid())
                o.context.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (o.operation),
                                                                             sourceType.getDescription(),
                                                                             destType.getDescription()));

            SanityCheckPass::expectSilentCastPossible (o.context, opTypes.operandType, o.target);
            SanityCheckPass::expectSilentCastPossible (o.context, opTypes.operandType, o.source);

            auto& binaryOp = allocator.allocate<AST::BinaryOperator> (o.context, o.target, o.source, o.operation);

            // special-case handling for addition of an int to a wrap or clamp type, as we want this to
            // work without the user needing to write it out long-hand with a cast
            if (destType.isBoundedInt() && sourceType.isInteger()
                 && (o.operation == BinaryOp::Op::add || o.operation == BinaryOp::Op::subtract))
            {
                auto& resultCast = allocator.allocate<AST::TypeCast> (o.source->context, destType, binaryOp);
                return allocator.allocate<AST::Assignment> (o.context, o.target, resultCast);
            }

            return allocator.allocate<AST::Assignment> (o.context, o.target, binaryOp);
        }